

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.cpp
# Opt level: O0

int64_t __thiscall llvm::DataExtractor::getSLEB128(DataExtractor *this,uint64_t *offset_ptr)

{
  ulong uVar1;
  long lVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t result;
  char *pcStack_28;
  uint bytes_read;
  char *error;
  uint64_t *offset_ptr_local;
  DataExtractor *this_local;
  
  uVar1 = *offset_ptr;
  error = (char *)offset_ptr;
  offset_ptr_local = (uint64_t *)this;
  sVar3 = StringRef::size(&this->Data);
  if (uVar1 <= sVar3) {
    pcVar4 = StringRef::data(&this->Data);
    lVar2 = *(long *)error;
    pcVar5 = StringRef::data(&this->Data);
    sVar3 = StringRef::size(&this->Data);
    this_local = (DataExtractor *)
                 decodeSLEB128((uint8_t *)(pcVar4 + lVar2),(uint *)((long)&result + 4),
                               (uint8_t *)(pcVar5 + sVar3),&stack0xffffffffffffffd8);
    if (pcStack_28 == (char *)0x0) {
      *(ulong *)error = (ulong)result._4_4_ + *(long *)error;
    }
    else {
      this_local = (DataExtractor *)0x0;
    }
    return (int64_t)this_local;
  }
  __assert_fail("*offset_ptr <= Data.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DataExtractor.cpp"
                ,0xc4,"int64_t llvm::DataExtractor::getSLEB128(uint64_t *) const");
}

Assistant:

int64_t DataExtractor::getSLEB128(uint64_t *offset_ptr) const {
  assert(*offset_ptr <= Data.size());

  const char *error;
  unsigned bytes_read;
  int64_t result = decodeSLEB128(
      reinterpret_cast<const uint8_t *>(Data.data() + *offset_ptr), &bytes_read,
      reinterpret_cast<const uint8_t *>(Data.data() + Data.size()), &error);
  if (error)
    return 0;
  *offset_ptr += bytes_read;
  return result;
}